

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Sphere::Sphere(Sphere *this,SphereInfo *info,Vector3D *position,double scale)

{
  Spectrum *a;
  Vector3D *in_RDX;
  long in_RSI;
  DiffuseBSDF *in_RDI;
  SceneObject *in_XMM0_Qa;
  Spectrum local_38 [2];
  
  SceneObject::SceneObject(in_XMM0_Qa);
  (in_RDI->super_BSDF)._vptr_BSDF = (_func_int **)&PTR_set_draw_styles_003ba640;
  in_RDI[6].super_BSDF._vptr_BSDF =
       (_func_int **)((double)*(float *)(in_RSI + 0x48) * (double)in_XMM0_Qa);
  Vector3D::Vector3D((Vector3D *)&in_RDI[6].super_BSDF.rasterize_color,in_RDX);
  if (*(long *)(in_RSI + 0x50) == 0) {
    a = (Spectrum *)operator_new(0x28);
    Spectrum::Spectrum(local_38,0.5,0.5,0.5);
    DiffuseBSDF::DiffuseBSDF(in_RDI,a);
    in_RDI[6].sampler.super_Sampler3D._vptr_Sampler3D = (_func_int **)a;
  }
  else {
    in_RDI[6].sampler.super_Sampler3D._vptr_Sampler3D =
         *(_func_int ***)(*(long *)(in_RSI + 0x50) + 0x48);
  }
  return;
}

Assistant:

Sphere::Sphere(const Collada::SphereInfo& info, const Vector3D& position,
               const double scale)
    : p(position), r(info.radius * scale) {
  if (info.material) {
    bsdf = info.material->bsdf;
  } else {
    bsdf = new DiffuseBSDF(Spectrum(0.5f, 0.5f, 0.5f));
  }
}